

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O2

void pbrt::detail::
     stringPrintfRecursive<bool_const&,float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
               (string *s,char *fmt,bool *v,float *args,float *args_1,float *args_2,float *args_3,
               float *args_4,float *args_5)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  float *v_00;
  bool *v_01;
  char *s_00;
  int line;
  char cVar5;
  enable_if_t<_std::is_class<typename_std::decay_t<const_bool_&>_>::value,_std::string> local_78;
  char *fmt_local;
  string nextFmt;
  
  v_00 = args;
  fmt_local = fmt;
  copyToFormatString(&nextFmt,&fmt_local,s);
  cVar5 = (char)&nextFmt;
  lVar1 = std::__cxx11::string::find(cVar5,0x2a);
  lVar2 = std::__cxx11::string::find(cVar5,0x73);
  lVar3 = std::__cxx11::string::find(cVar5,100);
  if (lVar1 != -1) {
    s_00 = "MEH";
    line = 0xbe;
LAB_00411739:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/print.h"
             ,line,s_00);
  }
  if (lVar2 == -1) {
    if (lVar3 == -1) {
      if (nextFmt._M_string_length == 0) {
        s_00 = "Excess values passed to Printf.";
        line = 0x10d;
        goto LAB_00411739;
      }
      formatOne<bool_const&>(&local_78,(detail *)nextFmt._M_dataplus._M_p,v,(bool *)v_00);
      std::__cxx11::string::append((string *)s);
    }
    else {
      uVar4 = std::__cxx11::string::find((char)&nextFmt,100);
      v_01 = (bool *)0x71a166;
      std::__cxx11::string::replace((ulong)&nextFmt,uVar4,(char *)0x1);
      formatOne<bool_const&>(&local_78,(detail *)nextFmt._M_dataplus._M_p,v,v_01);
      std::__cxx11::string::append((string *)s);
    }
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    std::__cxx11::string::append((char *)s);
  }
  stringPrintfRecursive<float_const&,float_const&,float_const&,float_const&,float_const&,float_const&>
            (s,fmt_local,args,args_1,args_2,args_3,args_4,args_5);
  std::__cxx11::string::~string((string *)&nextFmt);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}